

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::CollapseButton(ImGuiID id,ImVec2 *pos,ImGuiDockNode *dock_node)

{
  ImVec2 IVar1;
  ImGuiWindow *window;
  ImVec2 p_min;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  ImU32 col;
  ImU32 col_00;
  int iVar5;
  int idx;
  float fVar6;
  float fVar7;
  bool held;
  bool hovered;
  ImRect bb;
  ImVec2 local_38;
  
  pIVar2 = GImGui;
  window = GImGui->CurrentWindow;
  IVar1 = (GImGui->Style).FramePadding;
  fVar6 = IVar1.x;
  fVar7 = IVar1.y;
  bb.Min = *pos;
  bb.Max.y = fVar7 + fVar7 + GImGui->FontSize + (*pos).y;
  bb.Max.x = fVar6 + fVar6 + GImGui->FontSize + (*pos).x;
  ItemAdd(&bb,id,(ImRect *)0x0);
  bVar3 = ButtonBehavior(&bb,id,&hovered,&held,0);
  if (dock_node == (ImGuiDockNode *)0x0) {
    fVar6 = 0.0;
  }
  else {
    fVar6 = (float)(int)((pIVar2->Style).ItemInnerSpacing.x * -0.5) + 0.5;
  }
  iVar5 = ((held ^ 1U) & hovered) + 0x15;
  idx = 0x17;
  if ((hovered & 1U) == 0) {
    idx = iVar5;
  }
  if (held == false) {
    idx = iVar5;
  }
  col = GetColorU32(idx,1.0);
  col_00 = GetColorU32(0,1.0);
  if ((hovered != false) || (held == true)) {
    local_38.x = (bb.Min.x + bb.Max.x) * 0.5 + fVar6;
    local_38.y = (bb.Min.y + bb.Max.y) * 0.5 + 0.0 + -0.5;
    ImDrawList::AddCircleFilled(window->DrawList,&local_38,pIVar2->FontSize * 0.5 + 1.0,col,0xc);
  }
  IVar1 = (pIVar2->Style).FramePadding;
  fVar6 = IVar1.x + bb.Min.x;
  fVar7 = IVar1.y + bb.Min.y;
  if (dock_node == (ImGuiDockNode *)0x0) {
    IVar1.y = fVar7;
    IVar1.x = fVar6;
    RenderArrow(window->DrawList,IVar1,col_00,(window->Collapsed ^ 1) * 2 + 1,1.0);
  }
  else {
    p_min.y = fVar7;
    p_min.x = fVar6;
    RenderArrowDockMenu(window->DrawList,p_min,pIVar2->FontSize,col_00);
  }
  bVar4 = IsItemActive();
  if (bVar4) {
    bVar4 = IsMouseDragging(0,-1.0);
    if (bVar4) {
      StartMouseMovingWindowOrNode(window,dock_node,true);
    }
  }
  return bVar3;
}

Assistant:

bool ImGui::CollapseButton(ImGuiID id, const ImVec2& pos, ImGuiDockNode* dock_node)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ItemAdd(bb, id);
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_None);

    // Render
    //bool is_dock_menu = (window->DockNodeAsHost && !window->Collapsed);
    ImVec2 off = dock_node ? ImVec2(IM_FLOOR(-g.Style.ItemInnerSpacing.x * 0.5f) + 0.5f, 0.0f) : ImVec2(0.0f, 0.0f);
    ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    ImVec2 center = bb.GetCenter();
    if (hovered || held)
        window->DrawList->AddCircleFilled(center + off + ImVec2(0,-0.5f), g.FontSize * 0.5f + 1.0f, bg_col, 12);

    if (dock_node)
        RenderArrowDockMenu(window->DrawList, bb.Min + g.Style.FramePadding, g.FontSize, text_col);
    else
        RenderArrow(window->DrawList, bb.Min + g.Style.FramePadding, text_col, window->Collapsed ? ImGuiDir_Right : ImGuiDir_Down, 1.0f);

    // Switch to moving the window after mouse is moved beyond the initial drag threshold
    if (IsItemActive() && IsMouseDragging(0))
        StartMouseMovingWindowOrNode(window, dock_node, true);

    return pressed;
}